

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O1

bool __thiscall
flatbuffers::BinaryAnnotator::IsValidUnionValue
          (BinaryAnnotator *this,uint32_t enum_id,uint8_t value)

{
  Schema *pSVar1;
  long lVar2;
  Schema *pSVar3;
  ushort uVar4;
  
  pSVar1 = this->schema_;
  lVar2 = -(long)*(int *)pSVar1;
  if (*(ushort *)(pSVar1 + -(long)*(int *)pSVar1) < 7) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)(pSVar1 + lVar2 + 6);
  }
  if (*(uint *)(pSVar1 + (ulong)*(uint *)(pSVar1 + uVar4) + (ulong)uVar4) <= enum_id) {
    return false;
  }
  if (*(ushort *)(pSVar1 + -(long)*(int *)pSVar1) < 7) {
    uVar4 = 0;
  }
  else {
    uVar4 = *(ushort *)(pSVar1 + lVar2 + 6);
  }
  if (uVar4 == 0) {
    pSVar1 = (Schema *)0x0;
  }
  else {
    pSVar1 = pSVar1 + (ulong)*(uint *)(pSVar1 + uVar4) + (ulong)uVar4;
  }
  if (enum_id < *(uint *)pSVar1) {
    lVar2 = (ulong)*(uint *)(pSVar1 + (ulong)(enum_id << 2) + 4) + (ulong)(enum_id << 2);
    pSVar3 = pSVar1 + lVar2 + 4;
    if (*(ushort *)(pSVar3 + -(long)*(int *)pSVar3) < 7) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(ushort *)(pSVar1 + ((lVar2 + 10) - (long)*(int *)pSVar3));
    }
    return (uint)value < *(uint *)(pSVar3 + (ulong)*(uint *)(pSVar3 + uVar4) + (ulong)uVar4);
  }
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,
                "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
               );
}

Assistant:

bool IsValidUnionValue(const uint32_t enum_id, const uint8_t value) {
    if (enum_id >= schema_->enums()->size()) { return false; }

    const reflection::Enum *enum_def = schema_->enums()->Get(enum_id);

    if (enum_def == nullptr) { return false; }

    return value < enum_def->values()->size();
  }